

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void duckdb::
     TemplatedWritePlain<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator,false>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  bool bVar1;
  hugeint_t *phVar2;
  ulong in_RCX;
  ulong in_RDX;
  int64_t extraout_RDX;
  ParquetUUIDTargetType PVar3;
  hugeint_t input;
  ParquetUUIDTargetType target_value;
  idx_t r;
  idx_t local_write_count;
  ParquetUUIDTargetType local_write [2048];
  hugeint_t *ptr;
  ParquetUUIDTargetType *in_stack_ffffffffffff7f90;
  ParquetUUIDOperator *in_stack_ffffffffffff7f98;
  uint64_t uVar4;
  WriteStream *local_8058;
  ParquetUUIDTargetType *local_8050;
  ulong local_8048;
  
  phVar2 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0x5a61b4);
  local_8050 = in_stack_ffffffffffff7f90;
  for (local_8048 = in_RDX; local_8048 < in_RCX; local_8048 = local_8048 + 1) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffff7f98,
                       (idx_t)local_8050);
    if (bVar1) {
      in_stack_ffffffffffff7f98 = (ParquetUUIDOperator *)phVar2[local_8048].lower;
      uVar4 = phVar2[local_8048].upper;
      input.upper = extraout_RDX;
      input.lower = uVar4;
      PVar3 = ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                        (in_stack_ffffffffffff7f98,input);
      local_8058 = PVar3.bytes._0_8_;
      local_8050 = PVar3.bytes._8_8_;
      PVar3.bytes[8] = (char)uVar4;
      PVar3.bytes[9] = (char)(uVar4 >> 8);
      PVar3.bytes[10] = (char)(uVar4 >> 0x10);
      PVar3.bytes[0xb] = (char)(uVar4 >> 0x18);
      PVar3.bytes[0xc] = (char)(uVar4 >> 0x20);
      PVar3.bytes[0xd] = (char)(uVar4 >> 0x28);
      PVar3.bytes[0xe] = (char)(uVar4 >> 0x30);
      PVar3.bytes[0xf] = (char)(uVar4 >> 0x38);
      PVar3.bytes._0_8_ = in_stack_ffffffffffff7f98;
      ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                ((ColumnWriterStatistics *)local_8050,PVar3);
      ParquetUUIDOperator::WriteToStream<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                (local_8050,local_8058);
    }
  }
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}